

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalhandler.cc
# Opt level: O0

void google::anon_unknown_0::DumpStackFrameInfo(char *prefix,void *pc)

{
  bool bVar1;
  int iVar2;
  char *in_RDI;
  int width;
  MinimalFormatter formatter;
  char buf [1024];
  char symbolized [1024];
  char *symbol;
  char *in_stack_fffffffffffff7b8;
  char *pcVar3;
  void *in_stack_fffffffffffff7c0;
  code *pcVar4;
  int in_stack_fffffffffffff7d4;
  char *in_stack_fffffffffffff7d8;
  MinimalFormatter *in_stack_fffffffffffff7e0;
  char local_818 [1024];
  char local_418 [1024];
  char *local_18;
  char *local_8;
  
  local_18 = "(unknown)";
  local_8 = in_RDI;
  bVar1 = Symbolize(in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,0);
  if (bVar1) {
    local_18 = local_418;
  }
  MinimalFormatter::MinimalFormatter((MinimalFormatter *)&stack0xfffffffffffff7d0,local_818,0x400);
  MinimalFormatter::AppendString((MinimalFormatter *)&stack0xfffffffffffff7d0,local_8);
  MinimalFormatter::AppendString((MinimalFormatter *)&stack0xfffffffffffff7d0,"@ ");
  MinimalFormatter::AppendHexWithPadding
            (in_stack_fffffffffffff7e0,(uint64)in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d4);
  MinimalFormatter::AppendString((MinimalFormatter *)&stack0xfffffffffffff7d0," ");
  MinimalFormatter::AppendString((MinimalFormatter *)&stack0xfffffffffffff7d0,local_18);
  MinimalFormatter::AppendString((MinimalFormatter *)&stack0xfffffffffffff7d0,"\n");
  pcVar3 = local_818;
  pcVar4 = (code *)(anonymous_namespace)::g_failure_writer;
  iVar2 = MinimalFormatter::num_bytes_written((MinimalFormatter *)&stack0xfffffffffffff7d0);
  (*pcVar4)(pcVar3,iVar2);
  return;
}

Assistant:

void DumpStackFrameInfo(const char* prefix, void* pc) {
  // Get the symbol name.
  const char *symbol = "(unknown)";
  char symbolized[1024];  // Big enough for a sane symbol.
  // Symbolizes the previous address of pc because pc may be in the
  // next function.
  if (Symbolize(reinterpret_cast<char *>(pc) - 1,
                symbolized, sizeof(symbolized))) {
    symbol = symbolized;
  }

  char buf[1024];  // Big enough for stack frame info.
  MinimalFormatter formatter(buf, sizeof(buf));

  formatter.AppendString(prefix);
  formatter.AppendString("@ ");
  const int width = 2 * sizeof(void*) + 2;  // + 2  for "0x".
  formatter.AppendHexWithPadding(reinterpret_cast<uintptr_t>(pc), width);
  formatter.AppendString(" ");
  formatter.AppendString(symbol);
  formatter.AppendString("\n");
  g_failure_writer(buf, formatter.num_bytes_written());
}